

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

cf_errno_t cf_file_copy(cf_char_t *src,cf_char_t *dst)

{
  int __fd;
  int __fd_00;
  ssize_t sVar1;
  undefined1 local_438 [8];
  cf_char_t buff [1024];
  cf_int_t len;
  cf_int_t fd2;
  cf_int_t fd1;
  cf_char_t *dst_local;
  cf_char_t *src_local;
  
  if ((src == (cf_char_t *)0x0) || (dst == (cf_char_t *)0x0)) {
    src_local._4_4_ = 2;
  }
  else {
    __fd = open(src,0x42);
    if (__fd == 0) {
      src_local._4_4_ = 1;
    }
    else {
      __fd_00 = open(dst,0x42);
      if (__fd_00 == 0) {
        close(__fd);
        src_local._4_4_ = 1;
      }
      else {
        while( true ) {
          sVar1 = read(__fd,local_438,0x400);
          if ((int)sVar1 == 0) break;
          write(__fd_00,local_438,(long)(int)sVar1);
        }
        close(__fd);
        close(__fd_00);
        src_local._4_4_ = 0;
      }
    }
  }
  return src_local._4_4_;
}

Assistant:

cf_errno_t  cf_file_copy(const cf_char_t* src, const cf_char_t* dst) {
#ifndef CF_OS_WIN
    cf_int_t fd1 = 0;
    cf_int_t fd2 = 0;
    cf_int_t len;
    cf_char_t buff[1024]; 
#endif
    if(!src || !dst) return CF_EPARAM;
    
#ifdef CF_OS_WIN
    return CopyFileA(src, dst, 0) ? CF_OK : CF_NOK; /* copy force */
#else
    fd1 = open(src,O_RDWR|O_CREAT);
    if(!fd1) return CF_NOK;

    fd2 = open(dst,O_RDWR|O_CREAT);
    if(!fd2) {
        close(fd1);
        return CF_NOK;
    }
    while((len = read(fd1, buff, sizeof(buff)))) {  
        write(fd2, buff, len);
    }
    close(fd1);
    close(fd2);
    return CF_OK;
#endif
}